

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_strvp.c
# Opt level: O2

ares_htable_strvp_t * ares_htable_strvp_create(ares_htable_strvp_val_free_t val_free)

{
  ares_htable_strvp_t *p;
  ares_htable_t *paVar1;
  
  p = (ares_htable_strvp_t *)ares_malloc(0x10);
  if (p != (ares_htable_strvp_t *)0x0) {
    paVar1 = ares_htable_create(hash_func,bucket_key,bucket_free,key_eq);
    p->hash = paVar1;
    if (paVar1 != (ares_htable_t *)0x0) {
      p->free_val = val_free;
      return p;
    }
    ares_htable_destroy((ares_htable_t *)0x0);
    ares_free(p);
  }
  return (ares_htable_strvp_t *)0x0;
}

Assistant:

ares_htable_strvp_t *
  ares_htable_strvp_create(ares_htable_strvp_val_free_t val_free)
{
  ares_htable_strvp_t *htable = ares_malloc(sizeof(*htable));
  if (htable == NULL) {
    goto fail;
  }

  htable->hash = ares_htable_create(hash_func, bucket_key, bucket_free, key_eq);
  if (htable->hash == NULL) {
    goto fail;
  }

  htable->free_val = val_free;

  return htable;

fail:
  if (htable) {
    ares_htable_destroy(htable->hash);
    ares_free(htable);
  }
  return NULL;
}